

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O2

bool __thiscall
ON_3dmViewTraceImage::operator==(ON_3dmViewTraceImage *this,ON_3dmViewTraceImage *other)

{
  bool bVar1;
  ON_SHA1_Hash *a;
  ON_SHA1_Hash *b;
  
  bVar1 = ON_Plane::operator!=(&this->m_plane,&other->m_plane);
  if (!bVar1) {
    if ((this->m_width == other->m_width) && (!NAN(this->m_width) && !NAN(other->m_width))) {
      if ((this->m_height == other->m_height) && (!NAN(this->m_height) && !NAN(other->m_height))) {
        a = ON_FileReference::FullPathHash(&this->m_image_file_reference);
        b = ON_FileReference::FullPathHash(&other->m_image_file_reference);
        bVar1 = ::operator!=(a,b);
        if (((!bVar1) && (this->m_bHidden == other->m_bHidden)) &&
           (this->m_bGrayScale == other->m_bGrayScale)) {
          return this->m_bFiltered == other->m_bFiltered;
        }
      }
    }
  }
  return false;
}

Assistant:

bool ON_3dmViewTraceImage::operator==( const ON_3dmViewTraceImage& other ) const
{
  if ( m_plane != other.m_plane )
    return false;
  if ( m_width != other.m_width )
    return false;
  if ( m_height != other.m_height )
    return false;
  if( m_image_file_reference.FullPathHash() != other.m_image_file_reference.FullPathHash() )
    return false;
  if ( m_bHidden != other.m_bHidden )
    return false;
  if ( m_bGrayScale != other.m_bGrayScale )
    return false;
  if ( m_bFiltered != other.m_bFiltered )
    return false;
    
  return true;
}